

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall JSON::Parser::readToken(Token *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint code;
  int current;
  char *local_f0;
  size_type local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  char *local_d0;
  size_type local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  char *local_b0;
  size_type local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  char *local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  bVar2 = (this->input)._M_dataplus._M_p[this->pos];
  bVar3 = isNumberChar((uint)bVar2);
  if ((~bVar3 & bVar2 != 0x2d) == 0) {
    readNumberToken(__return_storage_ptr__,this);
  }
  else {
    code = (uint)bVar2;
    bVar3 = isWordChar(code);
    if (bVar3) {
      readWordToken(__return_storage_ptr__,this);
    }
    else {
      current = this->pos;
      if (code < 0x5b) {
        if (code == 0x22) {
          readStringToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        if (code == 0x2c) {
          this->pos = current + 1;
          local_f0 = &local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,",","");
          iVar4 = this->pos;
          __return_storage_ptr__->type = COMMA;
          paVar1 = &(__return_storage_ptr__->value).field_2;
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
          if (local_f0 == &local_e0) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_df,local_e0);
            *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_d8;
          }
          else {
            (__return_storage_ptr__->value)._M_dataplus._M_p = local_f0;
            (__return_storage_ptr__->value).field_2._M_allocated_capacity =
                 CONCAT71(uStack_df,local_e0);
          }
          (__return_storage_ptr__->value)._M_string_length = local_e8;
        }
        else {
          if (bVar2 != 0x3a) goto LAB_0010639c;
          this->pos = current + 1;
          local_d0 = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,":","");
          iVar4 = this->pos;
          __return_storage_ptr__->type = SEPARATOR;
          paVar1 = &(__return_storage_ptr__->value).field_2;
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
          if (local_d0 == &local_c0) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
            *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_b8;
          }
          else {
            (__return_storage_ptr__->value)._M_dataplus._M_p = local_d0;
            (__return_storage_ptr__->value).field_2._M_allocated_capacity =
                 CONCAT71(uStack_bf,local_c0);
          }
          (__return_storage_ptr__->value)._M_string_length = local_c8;
        }
      }
      else if (bVar2 < 0x7b) {
        if (bVar2 == 0x5b) {
          this->pos = current + 1;
          local_90 = &local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[","");
          iVar4 = this->pos;
          __return_storage_ptr__->type = BRACKETS_START;
          paVar1 = &(__return_storage_ptr__->value).field_2;
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
          if (local_90 == &local_80) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_7f,local_80);
            *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_78;
          }
          else {
            (__return_storage_ptr__->value)._M_dataplus._M_p = local_90;
            (__return_storage_ptr__->value).field_2._M_allocated_capacity =
                 CONCAT71(uStack_7f,local_80);
          }
          (__return_storage_ptr__->value)._M_string_length = local_88;
        }
        else {
          if (bVar2 != 0x5d) {
LAB_0010639c:
            unexpected(this,current);
            return (Token *)(ulong)(byte)(this->input)._M_dataplus._M_p[current];
          }
          this->pos = current + 1;
          local_b0 = &local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"]","");
          iVar4 = this->pos;
          __return_storage_ptr__->type = BRACKETS_END;
          paVar1 = &(__return_storage_ptr__->value).field_2;
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
          if (local_b0 == &local_a0) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
            *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_98;
          }
          else {
            (__return_storage_ptr__->value)._M_dataplus._M_p = local_b0;
            (__return_storage_ptr__->value).field_2._M_allocated_capacity =
                 CONCAT71(uStack_9f,local_a0);
          }
          (__return_storage_ptr__->value)._M_string_length = local_a8;
        }
      }
      else if (bVar2 == 0x7d) {
        this->pos = current + 1;
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
        iVar4 = this->pos;
        __return_storage_ptr__->type = BRACES_END;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        if (local_70 == &local_60) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_58;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = local_70;
          (__return_storage_ptr__->value).field_2._M_allocated_capacity =
               CONCAT71(uStack_5f,local_60);
        }
        (__return_storage_ptr__->value)._M_string_length = local_68;
      }
      else {
        if (bVar2 != 0x7b) goto LAB_0010639c;
        this->pos = current + 1;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{","");
        iVar4 = this->pos;
        __return_storage_ptr__->type = BRACES_START;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        if (local_50 == &local_40) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_38;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = local_50;
          (__return_storage_ptr__->value).field_2._M_allocated_capacity =
               CONCAT71(uStack_3f,local_40);
        }
        (__return_storage_ptr__->value)._M_string_length = local_48;
      }
      __return_storage_ptr__->start = current;
      __return_storage_ptr__->end = iVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readToken() {
        int code = getCodeAt(pos);

        if (isNumberChar(code) || code == 45) { // 0-9 or '-'
            return readNumberToken();
        } else if (isWordChar(code)) { // A-Z or a-z
            return readWordToken();
        }

        int startPos = pos;
        switch (code) {
            case 123: // '{'
                pos++;
                return Token(BRACES_START, "{", startPos, pos);
            case 125: // '}'
                pos++;
                return Token(BRACES_END, "}", startPos, pos);
            case 91: // '['
                pos++;
                return Token(BRACKETS_START, "[", startPos, pos);
            case 93: // ']'
                pos++;
                return Token(BRACKETS_END, "]", startPos, pos);
            case 58: // ':'
                pos++;
                return Token(SEPARATOR, ":", startPos, pos);
            case 44: // ','
                pos++;
                return Token(COMMA, ",", startPos, pos);
            case 34: // '"'
                return readStringToken();
            default:;
                unexpected(pos);
        }
    }